

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O2

void __thiscall OnDiskDataset::OnDiskDataset(OnDiskDataset *this,path *db_base,string *fname)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  reference pvVar3;
  reference pbVar4;
  size_type sVar5;
  json j;
  iterator __begin1;
  string cache_fname;
  string files_fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  iterator __end1;
  ifstream in;
  
  std::__cxx11::string::string((string *)this,(string *)fname);
  std::experimental::filesystem::v1::__cxx11::path::path(&this->db_base,db_base);
  (this->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
  super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
  super__Optional_payload_base<OnDiskFileIndex>._M_engaged = false;
  (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->taints)._M_t._M_impl.super__Rb_tree_header;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)&cache_fname,&this->name);
  std::experimental::filesystem::v1::__cxx11::operator/
            ((path *)&files_fname,db_base,(path *)&cache_fname);
  std::ifstream::ifstream(&in,files_fname._M_dataplus._M_p,_S_bin);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&files_fname);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&cache_fname);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&j,(nullptr_t)0x0);
  nlohmann::operator>>((istream *)&in,&j);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"indices");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&__begin1,pvVar3);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&__end1,pvVar3);
  while( true ) {
    bVar2 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=(&__begin1,&__end1);
    if (!bVar2) break;
    pbVar4 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&__begin1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_278,pbVar4);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              ((path *)&cache_fname,&local_278);
    std::experimental::filesystem::v1::__cxx11::operator/
              ((path *)&files_fname,db_base,(path *)&cache_fname);
    std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::
    emplace_back<std::experimental::filesystem::v1::__cxx11::path>
              (&this->indices,(path *)&files_fname);
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)&files_fname);
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)&cache_fname);
    std::__cxx11::string::~string((string *)&local_278);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(&__begin1);
  }
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"taints");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((iterator *)&files_fname,pvVar3);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&cache_fname,pvVar3);
  while( true ) {
    bVar2 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&files_fname,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&cache_fname);
    if (!bVar2) break;
    pbVar4 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&files_fname);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,pbVar4
              );
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->taints,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1);
    std::__cxx11::string::~string((string *)&__begin1);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *)&files_fname);
  }
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&j,"files");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&files_fname,pvVar3);
  cache_fname._M_dataplus._M_p = (pointer)&cache_fname.field_2;
  cache_fname._M_string_length = 0;
  cache_fname.field_2._M_local_buf[0] = '\0';
  sVar5 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[15]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)&j,(char (*) [15])"filename_cache");
  if (sVar5 == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,
                   "namecache.",&files_fname);
  }
  else {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&j,"filename_cache");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,pvVar3
              );
  }
  std::__cxx11::string::operator=((string *)&cache_fname,(string *)&__begin1);
  std::__cxx11::string::~string((string *)&__begin1);
  std::optional<OnDiskFileIndex>::
  emplace<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string&,std::__cxx11::string&>
            (&this->files_index,db_base,&files_fname,&cache_fname);
  if (sVar5 == 0) {
    save(this);
  }
  std::__cxx11::string::~string((string *)&cache_fname);
  std::__cxx11::string::~string((string *)&files_fname);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&j);
  std::ifstream::~ifstream(&in);
  return;
}

Assistant:

OnDiskDataset::OnDiskDataset(const fs::path &db_base, std::string fname)
    : name(std::move(fname)), db_base(db_base) {
    std::ifstream in(db_base / name, std::ifstream::binary);
    json j;
    in >> j;

    for (const std::string &index_fname : j["indices"]) {
        indices.emplace_back(db_base / index_fname);
    }

    for (const std::string &taint : j["taints"]) {
        taints.insert(taint);
    }

    std::string files_fname = j["files"];
    bool needs_save = false;
    std::string cache_fname;
    if (j.count("filename_cache") > 0) {
        cache_fname = j["filename_cache"];
    } else {
        cache_fname = "namecache." + files_fname;
        needs_save = true;
    }

    files_index.emplace(db_base, files_fname, cache_fname);

    if (needs_save) {
        save();
    }
}